

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O3

int demoSync(unqlite_file *pFile,int flags)

{
  int iVar1;
  
  if (*(int *)&pFile[4].pMethods != 0) {
    iVar1 = demoDirectWrite((DemoFile *)pFile,pFile[3].pMethods,*(int *)&pFile[4].pMethods,
                            (unqlite_int64)pFile[5].pMethods);
    *(undefined4 *)&pFile[4].pMethods = 0;
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  iVar1 = fsync(*(int *)&pFile[2].pMethods);
  return (uint)(iVar1 == 0) * 2 + -2;
}

Assistant:

static int demoSync(unqlite_file *pFile, int flags){
  DemoFile *p = (DemoFile*)pFile;
  int rc;

  rc = demoFlushBuffer(p);
  if( rc!=UNQLITE_OK ){
    return rc;
  }

#if defined(_MSC_VER) || defined(__MINGW32__)
  rc = _commit(p->fd);
#else
  rc = fsync(p->fd);
#endif /* defined(_MSC_VER) || defined(__MINGW32__) */
  return (rc==0 ? UNQLITE_OK : UNQLITE_IOERR);
}